

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

int mp_read_double(char **data,double *ret)

{
  char cVar1;
  char *pcVar2;
  ulong uVar3;
  ulong *puVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  pcVar2 = *data;
  cVar1 = *pcVar2;
  puVar4 = (ulong *)(pcVar2 + 1);
  switch(cVar1) {
  case -0x36:
    uVar5 = *(uint *)(pcVar2 + 1);
    puVar4 = (ulong *)(pcVar2 + 5);
    dVar7 = (double)(float)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                           uVar5 << 0x18);
    goto LAB_001140e2;
  case -0x35:
    uVar6 = *(ulong *)(pcVar2 + 1);
    puVar4 = (ulong *)(pcVar2 + 9);
    *ret = (double)(uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                    (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                    (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                    (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38);
    goto LAB_001140e9;
  case -0x34:
    uVar5 = (uint)(byte)pcVar2[1];
    goto LAB_001140b6;
  case -0x33:
    puVar4 = (ulong *)(pcVar2 + 3);
    uVar5 = (uint)(ushort)(*(ushort *)(pcVar2 + 1) << 8 | *(ushort *)(pcVar2 + 1) >> 8);
    break;
  case -0x32:
    uVar5 = *(uint *)(pcVar2 + 1);
    puVar4 = (ulong *)(pcVar2 + 5);
    dVar7 = (double)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18
                    );
    goto LAB_001140e2;
  case -0x31:
    uVar6 = *puVar4;
    uVar3 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8;
    uVar6 = uVar3 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    auVar8._8_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6;
    auVar8._12_4_ = 0x45300000;
    dVar7 = (auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    if (uVar6 != ((long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7)) {
      return -1;
    }
    goto LAB_001140ac;
  case -0x30:
    uVar5 = (uint)pcVar2[1];
LAB_001140b6:
    puVar4 = (ulong *)(pcVar2 + 2);
    break;
  case -0x2f:
    puVar4 = (ulong *)(pcVar2 + 3);
    uVar5 = (uint)(short)(*(ushort *)(pcVar2 + 1) << 8 | *(ushort *)(pcVar2 + 1) >> 8);
    break;
  case -0x2e:
    uVar5 = *(uint *)(pcVar2 + 1);
    uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    puVar4 = (ulong *)(pcVar2 + 5);
    break;
  case -0x2d:
    uVar6 = *puVar4;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    dVar7 = (double)(long)uVar6;
    if (uVar6 != (long)dVar7) {
      return -1;
    }
LAB_001140ac:
    puVar4 = (ulong *)(pcVar2 + 9);
    goto LAB_001140e2;
  default:
    if (cVar1 < -0x20) {
      return -1;
    }
    *ret = (double)(int)cVar1;
    goto LAB_001140e9;
  }
  dVar7 = (double)(int)uVar5;
LAB_001140e2:
  *ret = dVar7;
LAB_001140e9:
  *data = (char *)puVar4;
  return 0;
}

Assistant:

MP_IMPL int
mp_read_double(const char **data, double *ret)
{
	int64_t ival;
	uint64_t uval;
	double val;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t) mp_load_u8(&p);
		break;
	case 0xd1:
		*ret = (int16_t) mp_load_u16(&p);
		break;
	case 0xd2:
		*ret = (int32_t) mp_load_u32(&p);
		break;
	case 0xd3:
		ival = (int64_t) mp_load_u64(&p);
		val = (double) ival;
		if ((int64_t)val != ival)
			return -1;
		*ret = val;
		break;
	case 0xcc:
		*ret = mp_load_u8(&p);
		break;
	case 0xcd:
		*ret = mp_load_u16(&p);
		break;
	case 0xce:
		*ret = mp_load_u32(&p);
		break;
	case 0xcf:
		uval = mp_load_u64(&p);
		val = (double)uval;
		if ((uint64_t)val != uval)
			return -1;
		*ret = val;
		break;
	case 0xca:
		*ret = mp_load_float(&p);
		break;
	case 0xcb:
		*ret = mp_load_double(&p);
		break;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		break;
	}
	*data = p;
	return 0;
}